

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_log_module.c
# Opt level: O3

char * ngx_http_log_open_file_cache(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  char *__s1;
  long *plVar1;
  int iVar2;
  u_char *max;
  u_char *puVar3;
  ngx_open_file_cache_t *pnVar4;
  ngx_http_log_loc_conf_t *llcf;
  ulong uVar5;
  long *plVar6;
  undefined1 local_60 [8];
  ngx_str_t s;
  u_char *local_40;
  u_char *local_38;
  
  if (*(long *)((long)conf + 8) != -1) {
    return "is duplicate";
  }
  if (1 < cf->args->nelts) {
    s.data = (u_char *)0xa;
    local_38 = (u_char *)0x3c;
    uVar5 = 1;
    max = (u_char *)0x0;
    local_40 = &DAT_00000001;
    plVar1 = (long *)cf->args->elts;
    do {
      plVar6 = plVar1 + 2;
      __s1 = (char *)plVar1[3];
      iVar2 = strncmp(__s1,"max=",4);
      if (iVar2 == 0) {
        max = (u_char *)ngx_atoi((u_char *)(__s1 + 4),*plVar6 - 4);
        puVar3 = max;
joined_r0x00148070:
        if (puVar3 == (u_char *)0xffffffffffffffff) {
LAB_00148152:
          ngx_conf_log_error(1,cf,0,"invalid \"open_log_file_cache\" parameter \"%V\"",plVar6);
          return (char *)0xffffffffffffffff;
        }
      }
      else {
        iVar2 = strncmp(__s1,"inactive=",9);
        if (iVar2 == 0) {
          local_60 = (undefined1  [8])(*plVar6 - 9);
          s.len = (size_t)(__s1 + 9);
          s.data = (u_char *)ngx_parse_time((ngx_str_t *)local_60,1);
          puVar3 = s.data;
          goto joined_r0x00148070;
        }
        iVar2 = strncmp(__s1,"min_uses=",9);
        if (iVar2 == 0) {
          local_40 = (u_char *)ngx_atoi((u_char *)(__s1 + 9),*plVar6 - 9);
          puVar3 = local_40;
          goto joined_r0x00148070;
        }
        iVar2 = strncmp(__s1,"valid=",6);
        if (iVar2 == 0) {
          local_60 = (undefined1  [8])(*plVar6 - 6);
          s.len = (size_t)(__s1 + 6);
          local_38 = (u_char *)ngx_parse_time((ngx_str_t *)local_60,1);
          puVar3 = local_38;
          goto joined_r0x00148070;
        }
        iVar2 = strcmp(__s1,"off");
        if (iVar2 != 0) goto LAB_00148152;
        *(undefined8 *)((long)conf + 8) = 0;
      }
      uVar5 = uVar5 + 1;
      plVar1 = plVar6;
    } while (uVar5 < cf->args->nelts);
    if (*(long *)((long)conf + 8) == 0) {
      return (char *)0x0;
    }
    if (max != (u_char *)0x0) {
      pnVar4 = ngx_open_file_cache_init(cf->pool,(ngx_uint_t)max,(time_t)s.data);
      *(ngx_open_file_cache_t **)((long)conf + 8) = pnVar4;
      if (pnVar4 == (ngx_open_file_cache_t *)0x0) {
        return (char *)0xffffffffffffffff;
      }
      *(u_char **)((long)conf + 0x10) = local_38;
      *(u_char **)((long)conf + 0x18) = local_40;
      return (char *)0x0;
    }
  }
  ngx_conf_log_error(1,cf,0,"\"open_log_file_cache\" must have \"max\" parameter");
  return (char *)0xffffffffffffffff;
}

Assistant:

static char *
ngx_http_log_open_file_cache(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_log_loc_conf_t *llcf = conf;

    time_t       inactive, valid;
    ngx_str_t   *value, s;
    ngx_int_t    max, min_uses;
    ngx_uint_t   i;

    if (llcf->open_file_cache != NGX_CONF_UNSET_PTR) {
        return "is duplicate";
    }

    value = cf->args->elts;

    max = 0;
    inactive = 10;
    valid = 60;
    min_uses = 1;

    for (i = 1; i < cf->args->nelts; i++) {

        if (ngx_strncmp(value[i].data, "max=", 4) == 0) {

            max = ngx_atoi(value[i].data + 4, value[i].len - 4);
            if (max == NGX_ERROR) {
                goto failed;
            }

            continue;
        }

        if (ngx_strncmp(value[i].data, "inactive=", 9) == 0) {

            s.len = value[i].len - 9;
            s.data = value[i].data + 9;

            inactive = ngx_parse_time(&s, 1);
            if (inactive == (time_t) NGX_ERROR) {
                goto failed;
            }

            continue;
        }

        if (ngx_strncmp(value[i].data, "min_uses=", 9) == 0) {

            min_uses = ngx_atoi(value[i].data + 9, value[i].len - 9);
            if (min_uses == NGX_ERROR) {
                goto failed;
            }

            continue;
        }

        if (ngx_strncmp(value[i].data, "valid=", 6) == 0) {

            s.len = value[i].len - 6;
            s.data = value[i].data + 6;

            valid = ngx_parse_time(&s, 1);
            if (valid == (time_t) NGX_ERROR) {
                goto failed;
            }

            continue;
        }

        if (ngx_strcmp(value[i].data, "off") == 0) {

            llcf->open_file_cache = NULL;

            continue;
        }

    failed:

        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "invalid \"open_log_file_cache\" parameter \"%V\"",
                           &value[i]);
        return NGX_CONF_ERROR;
    }

    if (llcf->open_file_cache == NULL) {
        return NGX_CONF_OK;
    }

    if (max == 0) {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                        "\"open_log_file_cache\" must have \"max\" parameter");
        return NGX_CONF_ERROR;
    }

    llcf->open_file_cache = ngx_open_file_cache_init(cf->pool, max, inactive);

    if (llcf->open_file_cache) {

        llcf->open_file_cache_valid = valid;
        llcf->open_file_cache_min_uses = min_uses;

        return NGX_CONF_OK;
    }

    return NGX_CONF_ERROR;
}